

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int64_t mtree_atol(char **p,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  
  pcVar7 = *p;
  if (base == 0) {
    cVar11 = *pcVar7;
    base = 10;
    if (cVar11 != '0') goto LAB_00400a95;
    if ((byte)(pcVar7[1] | 0x20U) == 0x78) {
      pcVar7 = pcVar7 + 2;
      *p = pcVar7;
      base = 0x10;
      goto LAB_00400a92;
    }
    base = 8;
    uVar8 = 8;
    lVar3 = 0xfffffffffffffff;
    iVar9 = 7;
    iVar12 = 0x30;
  }
  else {
LAB_00400a92:
    cVar11 = *pcVar7;
LAB_00400a95:
    uVar8 = CONCAT44(0,base);
    if (cVar11 == '-') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8;
      auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000);
      lVar3 = SUB168(auVar2 / auVar1,0);
      *p = pcVar7 + 1;
      cVar11 = pcVar7[1];
      iVar9 = (int)cVar11;
      if ((byte)(cVar11 - 0x30U) < 10) {
        uVar10 = iVar9 - 0x30;
      }
      else if ((byte)(cVar11 + 0x9fU) < 6) {
        uVar10 = iVar9 - 0x61;
      }
      else {
        uVar10 = 0xffffffff;
        if ((byte)(cVar11 + 0xbfU) < 6) {
          uVar10 = iVar9 - 0x41;
        }
      }
      if (base <= (int)uVar10 || (int)uVar10 < 0) {
        return 0;
      }
      lVar5 = -lVar3;
      iVar9 = SUB164(auVar2 % auVar1,0);
      uVar6 = -iVar9;
      pcVar7 = pcVar7 + 2;
      lVar4 = 0;
      while( true ) {
        if (SBORROW8(lVar4,lVar5) != lVar4 + lVar3 < 0) {
          return -0x8000000000000000;
        }
        if ((lVar4 == lVar5) &&
           (uVar10 != uVar6 && SBORROW4(uVar10,uVar6) == (int)(uVar10 + iVar9) < 0)) break;
        *p = pcVar7;
        cVar11 = *pcVar7;
        iVar12 = (int)cVar11;
        if ((byte)(cVar11 - 0x30U) < 10) {
          uVar13 = iVar12 - 0x30;
        }
        else if ((byte)(cVar11 + 0x9fU) < 6) {
          uVar13 = iVar12 - 0x61;
        }
        else {
          uVar13 = iVar12 - 0x41;
          if (5 < (byte)(cVar11 + 0xbfU)) {
            uVar13 = 0xffffffff;
          }
        }
        lVar4 = lVar4 * uVar8 - (ulong)uVar10;
        if ((int)uVar13 < 0) {
          return lVar4;
        }
        pcVar7 = pcVar7 + 1;
        uVar10 = uVar13;
        if (base <= (int)uVar13) {
          return lVar4;
        }
      }
      return -0x8000000000000000;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
    lVar3 = SUB168(auVar1 / auVar2,0);
    iVar9 = SUB164(auVar1 % auVar2,0);
    iVar12 = (int)cVar11;
    if (9 < (byte)(cVar11 - 0x30U)) {
      if ((byte)(cVar11 + 0x9fU) < 6) {
        uVar10 = iVar12 - 0x61;
      }
      else {
        uVar10 = iVar12 - 0x41;
        if (5 < (byte)(cVar11 + 0xbfU)) {
          uVar10 = 0xffffffff;
        }
      }
      goto LAB_00400c33;
    }
  }
  uVar10 = iVar12 - 0x30;
LAB_00400c33:
  if (base <= (int)uVar10 || (int)uVar10 < 0) {
    return 0;
  }
  lVar4 = 0;
  while( true ) {
    pcVar7 = pcVar7 + 1;
    if (lVar3 < lVar4) {
      return 0x7fffffffffffffff;
    }
    if ((lVar4 == lVar3) && (iVar9 < (int)uVar10)) break;
    *p = pcVar7;
    cVar11 = *pcVar7;
    iVar12 = (int)cVar11;
    if ((byte)(cVar11 - 0x30U) < 10) {
      uVar6 = iVar12 - 0x30;
    }
    else if ((byte)(cVar11 + 0x9fU) < 6) {
      uVar6 = iVar12 - 0x61;
    }
    else {
      uVar6 = iVar12 - 0x41;
      if (5 < (byte)(cVar11 + 0xbfU)) {
        uVar6 = 0xffffffff;
      }
    }
    lVar4 = (ulong)uVar10 + lVar4 * uVar8;
    if ((int)uVar6 < 0) {
      return lVar4;
    }
    uVar10 = uVar6;
    if (base <= (int)uVar6) {
      return lVar4;
    }
  }
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t
mtree_atol(char **p, int base)
{
	int64_t l, limit;
	int digit, last_digit_limit;

	if (base == 0) {
		if (**p != '0')
			base = 10;
		else if ((*p)[1] == 'x' || (*p)[1] == 'X') {
			*p += 2;
			base = 16;
		} else {
			base = 8;
		}
	}

	if (**p == '-') {
		limit = INT64_MIN / base;
		last_digit_limit = INT64_MIN % base;
		++(*p);

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l < limit || (l == limit && digit > last_digit_limit))
				return INT64_MIN;
			l = (l * base) - digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	} else {
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l > limit || (l == limit && digit > last_digit_limit))
				return INT64_MAX;
			l = (l * base) + digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	}
}